

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

vm_intcls_ext * __thiscall CVmObjClass::alloc_ext(CVmObjClass *this)

{
  vm_intcls_ext *pvVar1;
  int iVar2;
  undefined4 extraout_var;
  
  pvVar1 = (vm_intcls_ext *)(this->super_CVmObject).ext_;
  if (pvVar1 != (vm_intcls_ext *)0x0) {
    return pvVar1;
  }
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x20,this);
  (this->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar2);
  return (vm_intcls_ext *)CONCAT44(extraout_var,iVar2);
}

Assistant:

vm_intcls_ext *CVmObjClass::alloc_ext(VMG0_)
{
    /* if I already have an extension, return it */
    if (ext_ != 0)
        return (vm_intcls_ext *)ext_;

    /* allocate the new extension */
    vm_intcls_ext *ext = (vm_intcls_ext *)G_mem->get_var_heap()->alloc_mem(
        sizeof(vm_intcls_ext), this);

    /* save it */
    ext_ = (char *)ext;

    /* return it */
    return ext;
}